

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O2

void __thiscall Omega_h::Write<int>::Write(Write<int> *this,Write<int> *param_2)

{
  Alloc *pAVar1;
  
  pAVar1 = (param_2->shared_alloc_).alloc;
  (this->shared_alloc_).alloc = pAVar1;
  (this->shared_alloc_).direct_ptr = (param_2->shared_alloc_).direct_ptr;
  if ((((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    pAVar1->use_count = pAVar1->use_count + -1;
    (this->shared_alloc_).alloc = (Alloc *)(pAVar1->size * 8 + 1);
  }
  (param_2->shared_alloc_).alloc = (Alloc *)0x0;
  (param_2->shared_alloc_).direct_ptr = (void *)0x0;
  return;
}

Assistant:

OMEGA_H_INLINE void move(SharedAlloc&& other) noexcept {
    alloc = other.alloc;
    direct_ptr = other.direct_ptr;
#ifndef __CUDA_ARCH__
    if (alloc && (!(reinterpret_cast<std::uintptr_t>(alloc) & FREE_MASK))) {
      // allocated
      if (entering_parallel) {
        --(alloc->use_count);
        alloc = reinterpret_cast<Alloc*>(
            (std::uintptr_t(alloc->size) << 3) | IN_PARALLEL);
      }
    }
#endif
    other.alloc = nullptr;
    other.direct_ptr = nullptr;
  }